

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiContext * ImGui::CreateContext(ImFontAtlas *shared_font_atlas)

{
  ImGuiContext *this;
  ImGuiContext *ctx;
  ImFontAtlas *shared_font_atlas_local;
  
  MemAlloc(0x3de0);
  this = (ImGuiContext *)operator_new(0x3de0);
  ImGuiContext::ImGuiContext(this,shared_font_atlas);
  if (GImGui == (ImGuiContext *)0x0) {
    SetCurrentContext(this);
  }
  Initialize(this);
  return this;
}

Assistant:

ImGuiContext* ImGui::CreateContext(ImFontAtlas* shared_font_atlas)
{
    ImGuiContext* ctx = IM_NEW(ImGuiContext)(shared_font_atlas);
    if (GImGui == NULL)
        SetCurrentContext(ctx);
    Initialize(ctx);
    return ctx;
}